

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect6-error.c
# Opt level: O0

int run_test_tcp_connect6_link_local(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int n;
  int ok;
  uv_tcp_t server;
  uv_connect_t req;
  sockaddr_in6 addr;
  uv_interface_address_t *p;
  uv_interface_address_t *ifs;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    ifs._4_4_ = 7;
  }
  else {
    iVar1 = uv_interface_addresses(&p,(int *)&eval_a);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
              ,99,"uv_interface_addresses(&ifs, &n)","==","0",(long)iVar1,"==",0);
      abort();
    }
    for (addr._20_8_ = p;
        ((ulong)addr._20_8_ < p + (int)eval_a &&
        ((*(short *)(addr._20_8_ + 0x14) != 10 || (*(short *)(addr._20_8_ + 0x1c) != -0x7f02))));
        addr._20_8_ = addr._20_8_ + 0x60) {
    }
    eval_a._4_4_ = (uint)((ulong)addr._20_8_ < p + (int)eval_a);
    uv_free_interface_addresses(p,(int)eval_a);
    if (eval_a._4_4_ == 0) {
      fprintf(_stderr,"%s\n","IPv6 link-local traffic not supported");
      fflush(_stderr);
      ifs._4_4_ = 7;
    }
    else {
      iVar1 = uv_ip6_addr("fe80::0bad:babe",0x539,(sockaddr_in6 *)((long)&req.queue.prev + 4));
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
                ,0x6e,"uv_ip6_addr(\"fe80::0bad:babe\", 1337, &addr)","==","0",(long)iVar1,"==",0);
        abort();
      }
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)&n);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
                ,0x6f,"uv_tcp_init(uv_default_loop(), &server)","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_tcp_connect((uv_connect_t *)&server.queued_fds,(uv_tcp_t *)&n,
                             (sockaddr *)((long)&req.queue.prev + 4),connect_cb);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
                ,0x7a,"uv_tcp_connect(&req, &server, (struct sockaddr*) &addr, connect_cb)","==","0"
                ,(long)iVar1,"==",0);
        abort();
      }
      uv_close((uv_handle_t *)&n,(uv_close_cb)0x0);
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
                ,0x7d,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
        abort();
      }
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
                ,0x7f,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
        abort();
      }
      uv_library_shutdown();
      ifs._4_4_ = 0;
    }
  }
  return ifs._4_4_;
}

Assistant:

TEST_IMPL(tcp_connect6_link_local) {
  uv_interface_address_t* ifs;
  uv_interface_address_t* p;
  struct sockaddr_in6 addr;
  uv_connect_t req;
  uv_tcp_t server;
  int ok;
  int n;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__QEMU__)
  /* qemu's sockaddr_in6 translation is broken pre-qemu 8.0.0
   * when host endianness != guest endiannes.
   * Fixed in https://github.com/qemu/qemu/commit/44cf6731d6b.
   */
  RETURN_SKIP("Test does not currently work in QEMU");
#endif  /* defined(__QEMU__) */

  /* Check there's an interface that routes link-local (fe80::/10) traffic. */
  ASSERT_OK(uv_interface_addresses(&ifs, &n));
  for (p = ifs; p < &ifs[n]; p++)
    if (p->address.address6.sin6_family == AF_INET6)
      if (!memcmp(&p->address.address6.sin6_addr, "\xfe\x80", 2))
        break;
  ok = (p < &ifs[n]);
  uv_free_interface_addresses(ifs, n);

  if (!ok)
    RETURN_SKIP("IPv6 link-local traffic not supported");

  ASSERT_OK(uv_ip6_addr("fe80::0bad:babe", 1337, &addr));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &server));

  /* We're making two shaky assumptions here:
   * 1. There is a network interface that routes IPv6 link-local traffic, and
   * 2. There is no firewall rule that blackholes or otherwise hard-kills the
   *    connection attempt to the address above, i.e., we don't expect the
   *    connect() system call to fail synchronously.
   */
  ASSERT_OK(uv_tcp_connect(&req,
                           &server,
                           (struct sockaddr*) &addr,
                           connect_cb));

  uv_close((uv_handle_t*) &server, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}